

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

int capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init(EVP_PKEY_CTX *ctx)

{
  ListBuilder builder;
  ListBuilder builder_00;
  ListSchema schema;
  ListSchema schema_00;
  ElementSize elementSize;
  Which WVar1;
  uint uVar2;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ListBuilder local_a0;
  Type local_78;
  Schema local_68;
  StructSize local_5c;
  ListBuilder local_58;
  Type local_30;
  uint local_1c;
  undefined1 auStack_18 [4];
  uint size_local;
  ListSchema schema_local;
  
  local_1c = in_ECX;
  _auStack_18 = in_RSI;
  schema_local.elementType._0_8_ = in_RDX;
  WVar1 = ListSchema::whichElementType((ListSchema *)auStack_18);
  if (WVar1 == STRUCT) {
    local_30.baseType = auStack_18._0_2_;
    local_30.listDepth = auStack_18[2];
    local_30.isImplicitParam = auStack_18[3];
    local_30.field_3 = size_local._0_2_;
    local_30._6_2_ = size_local._2_2_;
    local_30.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema_local.elementType._0_8_;
    uVar2 = bounded<unsigned_int>(local_1c);
    local_68.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)auStack_18);
    local_5c = anon_unknown_70::structSizeFromSchema((StructSchema)local_68.raw);
    PointerBuilder::initStructList(&local_58,(PointerBuilder *)&stack0x00000008,uVar2,local_5c);
    schema_00.elementType.field_4.schema = local_30.field_4.schema;
    schema_00.elementType.baseType = local_30.baseType;
    schema_00.elementType.listDepth = local_30.listDepth;
    schema_00.elementType.isImplicitParam = local_30.isImplicitParam;
    schema_00.elementType.field_3 = local_30.field_3;
    schema_00.elementType._6_2_ = local_30._6_2_;
    builder.capTable = local_58.capTable;
    builder.segment = local_58.segment;
    builder.ptr = local_58.ptr;
    builder.elementCount = local_58.elementCount;
    builder.step = local_58.step;
    builder.structDataSize = local_58.structDataSize;
    builder.structPointerCount = local_58.structPointerCount;
    builder.elementSize = local_58.elementSize;
    builder._39_1_ = local_58._39_1_;
    DynamicList::Builder::Builder((Builder *)ctx,schema_00,builder);
  }
  else {
    local_78.baseType = auStack_18._0_2_;
    local_78.listDepth = auStack_18[2];
    local_78.isImplicitParam = auStack_18[3];
    local_78.field_3 = size_local._0_2_;
    local_78._6_2_ = size_local._2_2_;
    local_78.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema_local.elementType._0_8_;
    WVar1 = ListSchema::whichElementType((ListSchema *)auStack_18);
    elementSize = anon_unknown_70::elementSizeFor(WVar1);
    uVar2 = bounded<unsigned_int>(local_1c);
    PointerBuilder::initList(&local_a0,(PointerBuilder *)&stack0x00000008,elementSize,uVar2);
    schema.elementType.field_4.schema = local_78.field_4.schema;
    schema.elementType.baseType = local_78.baseType;
    schema.elementType.listDepth = local_78.listDepth;
    schema.elementType.isImplicitParam = local_78.isImplicitParam;
    schema.elementType.field_3 = local_78.field_3;
    schema.elementType._6_2_ = local_78._6_2_;
    builder_00.capTable = local_a0.capTable;
    builder_00.segment = local_a0.segment;
    builder_00.ptr = local_a0.ptr;
    builder_00.elementCount = local_a0.elementCount;
    builder_00.step = local_a0.step;
    builder_00.structDataSize = local_a0.structDataSize;
    builder_00.structPointerCount = local_a0.structPointerCount;
    builder_00.elementSize = local_a0.elementSize;
    builder_00._39_1_ = local_a0._39_1_;
    DynamicList::Builder::Builder((Builder *)ctx,schema,builder_00);
  }
  return (int)ctx;
}

Assistant:

DynamicList::Builder PointerHelpers<DynamicList, Kind::OTHER>::init(
    PointerBuilder builder, ListSchema schema, uint size) {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(schema,
        builder.initStructList(bounded(size) * ELEMENTS,
            structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(schema,
        builder.initList(elementSizeFor(schema.whichElementType()), bounded(size) * ELEMENTS));
  }
}